

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

Matrix<float,_3,_4> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::decrement<float,3,4>
          (Matrix<float,_3,_4> *__return_storage_ptr__,MatrixCaseUtils *this,
          Matrix<float,_3,_4> *mat)

{
  Vector<float,_3> *pVVar1;
  Matrix<float,_3,_4> *pMVar2;
  int r;
  long lVar3;
  float *pfVar4;
  Matrix<float,_3,_4> *retVal;
  int row;
  long lVar5;
  long lVar6;
  undefined4 uVar7;
  
  pMVar2 = __return_storage_ptr__;
  *(undefined8 *)((__return_storage_ptr__->m_data).m_data[2].m_data + 2) = 0;
  pVVar1 = (__return_storage_ptr__->m_data).m_data;
  pVVar1[3].m_data[1] = 0.0;
  pVVar1[3].m_data[2] = 0.0;
  pVVar1 = (__return_storage_ptr__->m_data).m_data;
  pVVar1[1].m_data[1] = 0.0;
  pVVar1[1].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  *(undefined8 *)((__return_storage_ptr__->m_data).m_data[0].m_data + 2) = 0;
  lVar3 = 0;
  lVar5 = 0;
  pfVar4 = (float *)__return_storage_ptr__;
  do {
    lVar6 = 0;
    do {
      uVar7 = 0x3f800000;
      if (lVar3 != lVar6) {
        uVar7 = 0;
      }
      *(undefined4 *)((long)pfVar4 + lVar6) = uVar7;
      lVar6 = lVar6 + 0xc;
    } while (lVar6 != 0x30);
    lVar5 = lVar5 + 1;
    pfVar4 = pfVar4 + 1;
    lVar3 = lVar3 + 0xc;
  } while (lVar5 != 3);
  lVar3 = 0;
  do {
    lVar5 = 0;
    do {
      *(float *)((long)__return_storage_ptr__ + lVar5) = *(float *)(this + lVar5) + -1.0;
      lVar5 = lVar5 + 0xc;
    } while (lVar5 != 0x30);
    lVar3 = lVar3 + 1;
    this = this + 4;
    __return_storage_ptr__ = (Matrix<float,_3,_4> *)((long)__return_storage_ptr__ + 4);
  } while (lVar3 != 3);
  return pMVar2;
}

Assistant:

tcu::Matrix<T, Rows, Cols> decrement (const tcu::Matrix<T, Rows, Cols>& mat)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = mat(r, c) - 1.0f;

	return retVal;
}